

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::StringReplace
              (ScriptContext *scriptContext,JavascriptString *match,JavascriptString *input,
              RecyclableObject *replacefn)

{
  code *pcVar1;
  anon_class_48_6_667bc279 implicitCall;
  bool bVar2;
  charcount_t cchPrefix;
  charcount_t cVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  int iVar6;
  char *pcVar7;
  ScriptContext *pSVar8;
  undefined4 *puVar9;
  ThreadContext *this;
  Var aValue;
  JavascriptString *this_00;
  char16 *prefix;
  char16 *content;
  BufferStringBuilder local_b0;
  BufferStringBuilder bufferString;
  CharCount newLength;
  CharCount postfixLength;
  char16 *postfixStr;
  CharCount prefixLength;
  char16 *prefixStr;
  char16 *inputStr;
  JavascriptString *replace;
  undefined4 uStack_54;
  Var replaceVar;
  ThreadContext *threadContext;
  CharCount indexMatched;
  RecyclableObject *replacefn_local;
  JavascriptString *input_local;
  JavascriptString *match_local;
  ScriptContext *scriptContext_local;
  
  pcVar7 = JavascriptString::strstr((char *)input,(char *)match);
  cchPrefix = (charcount_t)pcVar7;
  pSVar8 = RecyclableObject::GetScriptContext(&match->super_RecyclableObject);
  if (pSVar8 != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5d1,"(match->GetScriptContext() == scriptContext)",
                                "match->GetScriptContext() == scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pSVar8 = RecyclableObject::GetScriptContext(&input->super_RecyclableObject);
  if (pSVar8 != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5d2,"(input->GetScriptContext() == scriptContext)",
                                "input->GetScriptContext() == scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  scriptContext_local = (ScriptContext *)input;
  if (cchPrefix != 0xffffffff) {
    this = ScriptContext::GetThreadContext(scriptContext);
    implicitCall._36_4_ = uStack_54;
    implicitCall.indexMatched = cchPrefix;
    implicitCall.threadContext = this;
    implicitCall.scriptContext = scriptContext;
    implicitCall.replacefn = replacefn;
    implicitCall.match = match;
    implicitCall.input = input;
    aValue = ThreadContext::
             ExecuteImplicitCall<Js::RegexHelper::StringReplace(Js::ScriptContext*,Js::JavascriptString*,Js::JavascriptString*,Js::RecyclableObject*)::__0>
                       (this,replacefn,ImplicitCall_Accessor,implicitCall);
    this_00 = JavascriptConversion::ToString(aValue,scriptContext);
    prefix = JavascriptString::GetString(input);
    cVar3 = JavascriptString::GetLength(match);
    cVar4 = JavascriptString::GetLength(input);
    cVar5 = JavascriptString::GetLength(match);
    bufferString.m_string._4_4_ = (cVar4 - cchPrefix) - cVar5;
    iVar6 = cchPrefix + bufferString.m_string._4_4_;
    cVar4 = JavascriptString::GetLength(this_00);
    cVar4 = iVar6 + cVar4;
    bufferString.m_string._0_4_ = cVar4;
    pSVar8 = RecyclableObject::GetScriptContext(&match->super_RecyclableObject);
    BufferStringBuilder::BufferStringBuilder(&local_b0,cVar4,pSVar8);
    content = JavascriptString::GetString(this_00);
    cVar4 = JavascriptString::GetLength(this_00);
    BufferStringBuilder::SetContent
              (&local_b0,prefix,cchPrefix,content,cVar4,
               prefix + ((ulong)pcVar7 & 0xffffffff) + (ulong)cVar3,bufferString.m_string._4_4_);
    scriptContext_local = (ScriptContext *)BufferStringBuilder::ToString(&local_b0);
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::StringReplace(ScriptContext* scriptContext, JavascriptString* match, JavascriptString* input, RecyclableObject* replacefn)
    {
        CharCount indexMatched = JavascriptString::strstr(input, match, true);
        Assert(match->GetScriptContext() == scriptContext);
        Assert(input->GetScriptContext() == scriptContext);

        if (indexMatched != CharCountFlag)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            Var replaceVar = threadContext->ExecuteImplicitCall(replacefn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                Var pThis = scriptContext->GetLibrary()->GetUndefined();
                return CALL_FUNCTION(threadContext, replacefn, CallInfo(4), pThis, match, JavascriptNumber::ToVar((int)indexMatched, scriptContext), input);
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceVar, scriptContext);
            const char16* inputStr = input->GetString();
            const char16* prefixStr = inputStr;
            CharCount prefixLength = indexMatched;
            const char16* postfixStr = inputStr + prefixLength + match->GetLength();
            CharCount postfixLength = input->GetLength() - prefixLength - match->GetLength();
            CharCount newLength = prefixLength + postfixLength + replace->GetLength();
            BufferStringBuilder bufferString(newLength, match->GetScriptContext());
            bufferString.SetContent(prefixStr, prefixLength,
                replace->GetString(), replace->GetLength(),
                postfixStr, postfixLength);
            return bufferString.ToString();
        }

        return input;
    }